

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sudoku.cpp
# Opt level: O0

bool __thiscall
Sudoku::columnCheck(Sudoku *this,
                   list<Sudoku::FurtherWays,_std::allocator<Sudoku::FurtherWays>_> *furtherWays_,
                   vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                   *testFields,bool recordFullFurtherWays,bool debug)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  __shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var5;
  element_type *peVar6;
  ostream *poVar7;
  reference pvVar8;
  uint local_3c;
  uint local_38;
  int y;
  int positionY;
  int nPossiblePositionsForValue;
  uint uStack_28;
  bool valueIsAlreadySet;
  int value;
  int x;
  bool restart;
  bool debug_local;
  bool recordFullFurtherWays_local;
  vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_> *testFields_local;
  list<Sudoku::FurtherWays,_std::allocator<Sudoku::FurtherWays>_> *furtherWays__local;
  Sudoku *this_local;
  
  bVar1 = false;
  uStack_28 = 0;
  do {
    if (this->squared_size_ <= (int)uStack_28) {
      return bVar1;
    }
    for (nPossiblePositionsForValue = 1; nPossiblePositionsForValue <= this->squared_size_;
        nPossiblePositionsForValue = nPossiblePositionsForValue + 1) {
      bVar2 = false;
      y = 0;
      local_38 = 0;
      for (local_3c = 0; (int)local_3c < this->squared_size_; local_3c = local_3c + 1) {
        iVar4 = (*this->_vptr_Sudoku[7])(this,(ulong)uStack_28,(ulong)local_3c);
        p_Var5 = (__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>::
                 operator[](testFields,(long)iVar4);
        peVar6 = std::__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(p_Var5);
        iVar4 = Field::value(peVar6);
        if (iVar4 == nPossiblePositionsForValue) {
          bVar2 = true;
          break;
        }
        iVar4 = (*this->_vptr_Sudoku[7])(this,(ulong)uStack_28,(ulong)local_3c);
        p_Var5 = (__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>::
                 operator[](testFields,(long)iVar4);
        peVar6 = std::__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(p_Var5);
        bVar3 = Field::valuePossible(peVar6,nPossiblePositionsForValue);
        if (bVar3) {
          y = y + 1;
          local_38 = local_3c;
        }
        if (1 < y) break;
      }
      if ((y == 1) && (!bVar2)) {
        if (debug) {
          poVar7 = std::operator<<((ostream *)&std::cout,"Column check (column ");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,uStack_28);
          poVar7 = std::operator<<(poVar7,"): value ");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,nPossiblePositionsForValue);
          poVar7 = std::operator<<(poVar7," has to be in field (");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,uStack_28);
          poVar7 = std::operator<<(poVar7,",");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_38);
          poVar7 = std::operator<<(poVar7,",");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,this->current_z_);
          poVar7 = std::operator<<(poVar7,")");
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        }
        pvVar8 = std::__cxx11::list<Sudoku::FurtherWays,_std::allocator<Sudoku::FurtherWays>_>::back
                           (furtherWays_);
        pvVar8->nColumnCheckMatches = pvVar8->nColumnCheckMatches + 1;
        pvVar8 = std::__cxx11::list<Sudoku::FurtherWays,_std::allocator<Sudoku::FurtherWays>_>::back
                           (furtherWays_);
        iVar4 = (*this->_vptr_Sudoku[7])(this,(ulong)uStack_28,(ulong)local_38);
        FurtherWays::addWay(pvVar8,iVar4,uStack_28,local_38,this->current_z_,
                            nPossiblePositionsForValue,onlyPositionInColumn);
        if (!recordFullFurtherWays) {
          iVar4 = (*this->_vptr_Sudoku[7])(this,(ulong)uStack_28,(ulong)local_38);
          p_Var5 = (__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>::
                   operator[](testFields,(long)iVar4);
          peVar6 = std::__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->(p_Var5);
          Field::setValue(peVar6,nPossiblePositionsForValue);
          bVar1 = true;
          break;
        }
      }
    }
    if (bVar1 != false) {
      return bVar1;
    }
    uStack_28 = uStack_28 + 1;
  } while( true );
}

Assistant:

bool Sudoku::columnCheck(std::list<FurtherWays> &furtherWays_, std::vector<std::shared_ptr<Field>> &testFields, bool recordFullFurtherWays, bool debug)
{
  bool restart = false;

  //check columns, if there are values that can only be at one position
  restart = false;
  for (int x = 0; x < squared_size_; x++)
  {

    for (int value = 1; value <= squared_size_; value++)
    {
      bool valueIsAlreadySet = false;
      int nPossiblePositionsForValue = 0;
      int positionY = 0;
      for (int y = 0; y < squared_size_; y++)
      {
        if(testFields[index(x,y)]->value() == value)
        {
          valueIsAlreadySet = true;
          break;
        }

        if(testFields[index(x,y)]->valuePossible(value))
        {
          nPossiblePositionsForValue++;
          positionY = y;
        }
        if(nPossiblePositionsForValue > 1)
          break;
      }

      //if Value can only be at one position, set it there
      if(nPossiblePositionsForValue == 1 && !valueIsAlreadySet)
      {
        if(debug)
          std::cout<<"Column check (column "<<x<<"): value "<<value<<" has to be in field ("<<x<<","<<positionY<<","<<current_z_<<")"<<std::endl;

        furtherWays_.back().nColumnCheckMatches++;
        furtherWays_.back().addWay(index(x,positionY), x, positionY, current_z_, value, FurtherWays::Reason::onlyPositionInColumn);

        if(!recordFullFurtherWays)
        {
          testFields[index(x,positionY)]->setValue(value);
          restart = true;
          break;
        }
      }
    }
    if(restart)
      break;
  }

  return restart;
}